

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticType.cpp
# Opt level: O3

StaticType *
Js::StaticType::New(ScriptContext *scriptContext,TypeId typeId,RecyclableObject *prototype,
                   JavascriptMethod entryPoint)

{
  Recycler *alloc;
  StaticType *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_a0d877f;
  data.filename._0_4_ = 0xc;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (StaticType *)new<Memory::Recycler>(0x28,alloc,0x387914);
  StaticType(this,scriptContext,typeId,prototype,entryPoint);
  return this;
}

Assistant:

StaticType *
    StaticType::New(ScriptContext* scriptContext, TypeId typeId, RecyclableObject* prototype, JavascriptMethod entryPoint)
    {
        return RecyclerNew(scriptContext->GetRecycler(), StaticType, scriptContext, typeId, prototype, entryPoint);
    }